

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

bool __thiscall
google::protobuf::UnknownFieldSet::ParseFromZeroCopyStream
          (UnknownFieldSet *this,ZeroCopyInputStream *input)

{
  bool bVar1;
  CodedInputStream coded_input;
  CodedInputStream local_60;
  
  io::CodedInputStream::CodedInputStream(&local_60,input);
  bVar1 = ParseFromCodedStream(this,&local_60);
  io::CodedInputStream::~CodedInputStream(&local_60);
  return (bool)(bVar1 & local_60.legitimate_message_end_);
}

Assistant:

bool UnknownFieldSet::ParseFromZeroCopyStream(io::ZeroCopyInputStream* input) {
  io::CodedInputStream coded_input(input);
  return (ParseFromCodedStream(&coded_input) &&
          coded_input.ConsumedEntireMessage());
}